

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int compress(int elen,double *e,double *h)

{
  double dVar1;
  double dVar2;
  int local_60;
  int local_5c;
  int bottom;
  int top;
  double hnow;
  double enow;
  double bvirt;
  int hindex;
  int eindex;
  double Qnew;
  double q;
  double Q;
  double *h_local;
  double *e_local;
  int elen_local;
  
  local_60 = elen + -1;
  q = e[local_60];
  for (bvirt._4_4_ = elen + -2; -1 < bvirt._4_4_; bvirt._4_4_ = bvirt._4_4_ + -1) {
    dVar1 = q + e[bvirt._4_4_];
    dVar2 = e[bvirt._4_4_] - (dVar1 - q);
    if ((dVar2 != 0.0) || (q = dVar1, NAN(dVar2))) {
      h[local_60] = dVar1;
      local_60 = local_60 + -1;
      q = dVar2;
    }
  }
  local_5c = 0;
  while (bvirt._0_4_ = local_60 + 1, bvirt._0_4_ < elen) {
    dVar1 = h[bvirt._0_4_] + q;
    dVar2 = q - (dVar1 - h[bvirt._0_4_]);
    local_60 = bvirt._0_4_;
    q = dVar1;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      h[local_5c] = dVar2;
      local_5c = local_5c + 1;
    }
  }
  h[local_5c] = q;
  return local_5c + 1;
}

Assistant:

int compress(int elen, REAL *e, REAL *h)
/* e and h may be the same. */
{
  REAL Q, q;
  INEXACT REAL Qnew;
  int eindex, hindex;
  INEXACT REAL bvirt;
  REAL enow, hnow;
  int top, bottom;

  bottom = elen - 1;
  Q = e[bottom];
  for (eindex = elen - 2; eindex >= 0; eindex--) {
    enow = e[eindex];
    Fast_Two_Sum(Q, enow, Qnew, q);
    if (q != 0) {
      h[bottom--] = Qnew;
      Q = q;
    } else {
      Q = Qnew;
    }
  }
  top = 0;
  for (hindex = bottom + 1; hindex < elen; hindex++) {
    hnow = h[hindex];
    Fast_Two_Sum(hnow, Q, Qnew, q);
    if (q != 0) {
      h[top++] = q;
    }
    Q = Qnew;
  }
  h[top] = Q;
  return top + 1;
}